

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

void __thiscall RoboClaw::RoboClaw(RoboClaw *this)

{
  this->_vptr_RoboClaw = (_func_int **)&PTR_write_0010ad98;
  (this->m_portName)._M_dataplus._M_p = (pointer)&(this->m_portName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_portName,"/dev/ttyS0","");
  this->m_timeout = 5;
  this->m_address = 0x80;
  this->m_serial = -1;
  return;
}

Assistant:

RoboClaw::RoboClaw()
    : m_portName( "/dev/ttyS0" )
    , m_timeout( 5 )
    , m_address( 0x80 )  // 0x80-0x87 is used to identify a RoboClaw on a serial port, but on USB this is ignored.
{
    init();
}